

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

string * cmsys::SystemTools::GetRealPath
                   (string *__return_storage_ptr__,string *path,string *errorMessage)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  Realpath(path,__return_storage_ptr__,errorMessage);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::GetRealPath(const std::string& path,
                                           std::string* errorMessage)
{
  std::string ret;
  Realpath(path, ret, errorMessage);
  return ret;
}